

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  code *pcVar1;
  code *pcVar2;
  undefined *puVar3;
  xml_encoding xVar4;
  xml_parse_result *extraout_RAX;
  byte *pbVar5;
  xml_parse_result *extraout_RAX_00;
  size_t sVar6;
  size_t sVar7;
  xml_node_struct *pxVar8;
  xml_node_struct *pxVar9;
  xml_attribute_struct *pxVar10;
  xml_parse_result *pxVar11;
  xml_node_struct **ppxVar12;
  byte bVar13;
  byte bVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  byte *pbVar19;
  uint uVar20;
  xml_parse_status xVar21;
  long lVar22;
  long lVar23;
  ushort *puVar24;
  ushort *puVar25;
  ulong uVar26;
  ushort uVar27;
  long lVar28;
  byte bVar29;
  byte *pbVar30;
  size_t sVar31;
  void *pvVar32;
  byte *pbVar33;
  xml_allocator *alloc;
  xml_parse_result *pxVar34;
  byte *pbVar35;
  byte *pbVar36;
  bool bVar37;
  xml_parse_result result;
  byte *local_98;
  xml_node_struct *local_78;
  xml_parse_result local_48;
  
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return extraout_RAX;
  }
  xVar4 = get_buffer_encoding(encoding,contents,size);
  puVar3 = (anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  pvVar32 = (void *)0x0;
  if (own) {
    pvVar32 = contents;
  }
  pbVar5 = (byte *)contents;
  if (xVar4 == encoding_utf8) {
    if (!is_mutable) {
      pbVar5 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(size + 1);
joined_r0x006f57db:
      if (pbVar5 == (byte *)0x0) goto LAB_006f5879;
      if (contents != (void *)0x0) {
        memcpy(pbVar5,contents,size);
      }
      sVar31 = size + 1;
      pbVar30 = pbVar5 + size;
      goto LAB_006f4590;
    }
  }
  else if ((xVar4 & ~encoding_utf8) == encoding_utf16_le) {
    uVar26 = size >> 1;
    if (xVar4 == encoding_utf16_le) {
      if (size < 2) {
        pbVar30 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(1);
LAB_006f457f:
        sVar31 = 1;
        pbVar5 = pbVar30;
        if (pbVar30 == (byte *)0x0) {
LAB_006f5879:
          xml_parse_result::xml_parse_result(__return_storage_ptr__);
          __return_storage_ptr__->status = status_out_of_memory;
          __return_storage_ptr__->offset = 0;
          if (pvVar32 != (void *)0x0) {
            pxVar11 = (xml_parse_result *)(*(code *)puVar3)(pvVar32);
            return pxVar11;
          }
          return __return_storage_ptr__;
        }
      }
      else {
        lVar23 = 0;
        uVar18 = uVar26;
        puVar24 = (ushort *)contents;
        do {
          uVar15 = *puVar24;
          if (uVar15 < 0xd800) {
            lVar22 = 3 - (ulong)(uVar15 < 0x800);
            if (uVar15 < 0x80) {
              lVar22 = 1;
            }
            lVar23 = lVar23 + lVar22;
LAB_006f4503:
            lVar22 = -1;
            puVar25 = puVar24 + 1;
          }
          else {
            if ((~uVar15 & 0xe000) == 0) {
              lVar23 = lVar23 + 3;
              goto LAB_006f4503;
            }
            puVar25 = puVar24 + 1;
            lVar22 = -1;
            if (((uVar18 != 1) && ((uVar15 & 0xfc00) == 0xd800)) && ((*puVar25 & 0xfc00) == 0xdc00))
            {
              lVar23 = lVar23 + 4;
              lVar22 = -2;
              puVar25 = puVar24 + 2;
            }
          }
          puVar24 = puVar25;
          uVar18 = uVar18 + lVar22;
        } while (uVar18 != 0);
        sVar31 = lVar23 + 1;
        pbVar5 = (byte *)(*(code *)(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)(sVar31);
        pbVar30 = pbVar5;
        puVar24 = (ushort *)contents;
        if (pbVar5 == (byte *)0x0) goto LAB_006f5879;
        do {
          uVar15 = *puVar24;
          uVar20 = (uint)uVar15;
          if ((uVar15 < 0xd800) || ((~uVar15 & 0xe000) == 0)) {
            pbVar30 = utf8_writer::low(pbVar30,uVar20);
            puVar25 = puVar24 + 1;
            lVar23 = -1;
          }
          else {
            puVar25 = puVar24 + 1;
            lVar23 = -1;
            if ((uVar26 != 1) && ((uVar20 & 0xfc00) == 0xd800)) {
              uVar15 = *puVar25;
              if ((uVar15 & 0xfc00) == 0xdc00) {
                uVar16 = (uVar20 << 10 & 0xffc00) + 0x10000;
                *pbVar30 = (byte)(uVar16 >> 0x12) | 0xf0;
                pbVar30[1] = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                pbVar30[2] = (byte)((uVar15 & 0x3c0 | uVar20 << 10) >> 6) & 0x3f | 0x80;
                pbVar30[3] = (byte)uVar15 & 0x3f | 0x80;
                pbVar30 = pbVar30 + 4;
                puVar25 = puVar24 + 2;
                lVar23 = -2;
              }
            }
          }
          uVar26 = uVar26 + lVar23;
          puVar24 = puVar25;
        } while (uVar26 != 0);
      }
    }
    else {
      if (size < 2) {
        pbVar30 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)(1);
        goto LAB_006f457f;
      }
      lVar23 = 0;
      uVar18 = uVar26;
      puVar24 = (ushort *)contents;
      do {
        uVar15 = *puVar24 << 8;
        uVar27 = uVar15 | *puVar24 >> 8;
        if (uVar27 < 0xd800) {
          lVar22 = 3 - (ulong)(uVar27 < 0x800);
          if (uVar27 < 0x80) {
            lVar22 = 1;
          }
          lVar23 = lVar23 + lVar22;
LAB_006f5392:
          lVar22 = -1;
          puVar25 = puVar24 + 1;
        }
        else {
          if ((~uVar27 & 0xe000) == 0) {
            lVar23 = lVar23 + 3;
            goto LAB_006f5392;
          }
          puVar25 = puVar24 + 1;
          lVar22 = -1;
          if (((uVar18 != 1) && ((uVar15 & 0xfc00) == 0xd800)) && ((*puVar25 & 0xfc) == 0xdc)) {
            lVar23 = lVar23 + 4;
            lVar22 = -2;
            puVar25 = puVar24 + 2;
          }
        }
        puVar24 = puVar25;
        uVar18 = uVar18 + lVar22;
      } while (uVar18 != 0);
      sVar31 = lVar23 + 1;
      pbVar5 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(sVar31);
      pbVar30 = pbVar5;
      puVar24 = (ushort *)contents;
      if (pbVar5 == (byte *)0x0) goto LAB_006f5879;
      do {
        uVar15 = *puVar24 << 8 | *puVar24 >> 8;
        uVar20 = (uint)uVar15;
        if ((uVar15 < 0xd800) || ((~uVar15 & 0xe000) == 0)) {
          pbVar30 = utf8_writer::low(pbVar30,uVar20);
          puVar25 = puVar24 + 1;
          lVar23 = -1;
        }
        else {
          puVar25 = puVar24 + 1;
          lVar23 = -1;
          if ((uVar26 != 1) && ((uVar20 & 0xfc00) == 0xd800)) {
            uVar15 = *puVar25;
            uVar16 = (uint)(ushort)(uVar15 << 8 | uVar15 >> 8);
            if ((uVar16 & 0xfc00) == 0xdc00) {
              uVar17 = (uVar20 << 10 & 0xffc00) + 0x10000;
              *pbVar30 = (byte)(uVar17 >> 0x12) | 0xf0;
              pbVar30[1] = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
              pbVar30[2] = (byte)((uVar16 & 0x3c0 | uVar20 << 10) >> 6) & 0x3f | 0x80;
              pbVar30[3] = (byte)(uVar15 >> 8) & 0x3f | 0x80;
              pbVar30 = pbVar30 + 4;
              puVar25 = puVar24 + 2;
              lVar23 = -2;
            }
          }
        }
        uVar26 = uVar26 + lVar23;
        puVar24 = puVar25;
      } while (uVar26 != 0);
    }
LAB_006f4590:
    *pbVar30 = 0;
    size = sVar31;
  }
  else {
    if (xVar4 - encoding_utf32_le < 2) {
      uVar26 = size >> 2;
      if (xVar4 == encoding_utf32_le) {
        if (size < 4) {
          pbVar30 = (byte *)(*(code *)(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)(1);
          goto LAB_006f457f;
        }
        uVar18 = 0;
        lVar23 = 0;
        do {
          uVar20 = *(uint *)((long)contents + uVar18 * 4);
          if (uVar20 < 0x10000) {
            lVar22 = 3 - (ulong)(uVar20 < 0x800);
            if (uVar20 < 0x80) {
              lVar22 = 1;
            }
            lVar23 = lVar23 + lVar22;
          }
          else {
            lVar23 = lVar23 + 4;
          }
          uVar18 = uVar18 + 1;
        } while (uVar26 != uVar18);
        sVar31 = lVar23 + 1;
        pbVar5 = (byte *)(*(code *)(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)(sVar31);
        if (pbVar5 == (byte *)0x0) goto LAB_006f5879;
        uVar18 = 0;
        pbVar30 = pbVar5;
        do {
          uVar20 = *(uint *)((long)contents + uVar18 * 4);
          if (uVar20 < 0x10000) {
            pbVar30 = utf8_writer::low(pbVar30,uVar20);
          }
          else {
            *pbVar30 = (byte)(uVar20 >> 0x12) | 0xf0;
            pbVar30[1] = (byte)(uVar20 >> 0xc) & 0x3f | 0x80;
            pbVar30[2] = (byte)(uVar20 >> 6) & 0x3f | 0x80;
            pbVar30[3] = (byte)uVar20 & 0x3f | 0x80;
            pbVar30 = pbVar30 + 4;
          }
          uVar18 = uVar18 + 1;
        } while (uVar26 != uVar18);
      }
      else {
        if (size < 4) {
          pbVar30 = (byte *)(*(code *)(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)(1);
          goto LAB_006f457f;
        }
        uVar18 = 0;
        lVar23 = 0;
        do {
          uVar20 = *(uint *)((long)contents + uVar18 * 4);
          uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                   uVar20 << 0x18;
          if (uVar20 < 0x10000) {
            lVar22 = 3 - (ulong)(uVar20 < 0x800);
            if (uVar20 < 0x80) {
              lVar22 = 1;
            }
            lVar23 = lVar23 + lVar22;
          }
          else {
            lVar23 = lVar23 + 4;
          }
          uVar18 = uVar18 + 1;
        } while (uVar26 != uVar18);
        sVar31 = lVar23 + 1;
        pbVar5 = (byte *)(*(code *)(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)(sVar31);
        if (pbVar5 == (byte *)0x0) goto LAB_006f5879;
        uVar18 = 0;
        pbVar30 = pbVar5;
        do {
          uVar20 = *(uint *)((long)contents + uVar18 * 4);
          uVar16 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                   uVar20 << 0x18;
          if (uVar16 < 0x10000) {
            pbVar30 = utf8_writer::low(pbVar30,uVar16);
          }
          else {
            *pbVar30 = (byte)(uVar16 >> 0x12) | 0xf0;
            pbVar30[1] = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
            pbVar30[2] = (byte)(uVar16 >> 6) & 0x3f | 0x80;
            pbVar30[3] = (byte)(uVar20 >> 0x18) & 0x3f | 0x80;
            pbVar30 = pbVar30 + 4;
          }
          uVar18 = uVar18 + 1;
        } while (uVar26 != uVar18);
      }
      goto LAB_006f4590;
    }
    if (xVar4 != encoding_latin1) goto LAB_006f5879;
    sVar6 = 0;
    if (size == 0) {
LAB_006f55ef:
      if (size != sVar6) {
        if (size == sVar6) {
          lVar23 = 0;
        }
        else {
          lVar23 = 0;
          sVar7 = sVar6;
          do {
            lVar23 = (lVar23 - (ulong)(-1 < *(char *)((long)contents + sVar7))) + 2;
            sVar7 = sVar7 + 1;
          } while (size != sVar7);
        }
        sVar31 = sVar6 + lVar23 + 1;
        pbVar5 = (byte *)(*(code *)(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)(sVar31);
        if (pbVar5 == (byte *)0x0) goto LAB_006f5879;
        memcpy(pbVar5,contents,sVar6);
        pbVar30 = pbVar5 + sVar6;
        for (; size != sVar6; sVar6 = sVar6 + 1) {
          pbVar30 = utf8_writer::low(pbVar30,(uint)*(byte *)((long)contents + sVar6));
        }
        goto LAB_006f4590;
      }
    }
    else {
      do {
        if (*(char *)((long)contents + sVar6) < '\0') goto LAB_006f55ef;
        sVar6 = sVar6 + 1;
      } while (size != sVar6);
    }
    if (!is_mutable) {
      pbVar5 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(size + 1);
      goto joined_r0x006f57db;
    }
  }
  if (own) {
    if ((contents != (void *)0x0) && (pbVar5 != (byte *)contents)) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
LAB_006f45c7:
    *out_buffer = (char_t *)pbVar5;
  }
  else if (pbVar5 != (byte *)contents) goto LAB_006f45c7;
  doc->buffer = (char_t *)pbVar5;
  if (size == 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
    __return_storage_ptr__->offset = 0;
    pxVar11 = extraout_RAX_00;
LAB_006f5aaa:
    __return_storage_ptr__->encoding = xVar4;
    return pxVar11;
  }
  if (root->first_child == (xml_node_struct *)0x0) {
    local_78 = (xml_node_struct *)0x0;
  }
  else {
    local_78 = root->first_child->prev_sibling_c;
  }
  endch = pbVar5[size - 1];
  pbVar5[size - 1] = 0;
  local_98 = pbVar5;
  if ((*pbVar5 == 0xef) && (pbVar5[1] == 0xbb)) {
    local_98 = pbVar5 + (ulong)(pbVar5[2] == 0xbf) * 3;
  }
  alloc = &doc->super_xml_allocator;
  pxVar11 = (xml_parse_result *)(size - 1);
  pcVar1 = *(code **)((long)&PTR_parse_simple_008776b8 + (ulong)(options >> 1 & 0x78));
  pcVar2 = (code *)(&PTR_parse_00877738)[options >> 9 & 4 | options >> 4 & 3];
  bVar29 = endch ^ 0x3e;
  pxVar8 = root;
  pbVar30 = local_98;
LAB_006f46ea:
  uVar26 = (ulong)*pbVar30;
  do {
    pbVar35 = pbVar30;
    if ((char)uVar26 == '\0') goto LAB_006f531d;
    if ((int)uVar26 == 0x3c) goto LAB_006f4771;
    bVar13 = (anonymous_namespace)::chartype_table[uVar26];
    pbVar30 = pbVar35;
    while ((bVar13 & 8) != 0) {
      uVar26 = (ulong)pbVar30[1];
      pbVar30 = pbVar30 + 1;
      bVar13 = (anonymous_namespace)::chartype_table[uVar26];
    }
  } while ((((char)uVar26 == '<') || ((int)uVar26 == 0)) &&
          (((options >> 0xb & 1) != 0 || (options & 0x408) == 0 ||
           (((options >> 10 & 1) != 0 &&
            ((((char)uVar26 != '<' || (pbVar30[1] != 0x2f)) ||
             (pxVar8->first_child != (xml_node_struct *)0x0))))))));
  pbVar33 = pbVar35;
  if ((options >> 0xb & 1) != 0) {
    pbVar33 = pbVar30;
  }
  if (((options >> 0xc & 1) != 0) || (pbVar35 = pbVar33, pxVar8->parent != (xml_node_struct *)0x0))
  {
    pbVar35 = (byte *)(*pcVar2)(pbVar33);
    if ((((options >> 0xd & 1) == 0) ||
        ((pxVar8->parent == (xml_node_struct *)0x0 ||
         (pxVar8->first_child != (xml_node_struct *)0x0)))) || (pxVar8->value != (char_t *)0x0)) {
      if ((((options >> 0xe & 1) != 0) && (pxVar8->first_child != (xml_node_struct *)0x0)) &&
         ((pxVar8->first_child->prev_sibling_c->header & 0xf) == 3)) {
        sVar6 = strlen((char *)local_98);
        sVar7 = strlen((char *)pbVar33);
        memmove(local_98 + sVar6,pbVar33,sVar7 + 1);
        local_98 = local_98 + sVar6 + sVar7;
        goto LAB_006f4832;
      }
      pxVar9 = append_new_node(pxVar8,alloc,node_pcdata);
      if (pxVar9 != (xml_node_struct *)0x0) {
        pxVar9->value = (char_t *)pbVar33;
        local_98 = pbVar33;
        goto LAB_006f4832;
      }
LAB_006f58bb:
      xVar21 = status_out_of_memory;
      pbVar33 = pbVar35;
    }
    else {
      pxVar8->value = (char_t *)pbVar33;
LAB_006f4832:
      bVar13 = *pbVar35;
      if (bVar13 != 0) goto LAB_006f4843;
LAB_006f531d:
      pbVar33 = (byte *)0x0;
      if (pxVar8 != root) {
        pbVar33 = pbVar35;
      }
      xVar21 = status_end_element_mismatch;
      if (pxVar8 == root) {
        xVar21 = status_ok;
      }
    }
    goto LAB_006f59bd;
  }
  while( true ) {
    if (*pbVar35 == 0) goto LAB_006f531d;
    if (*pbVar35 == 0x3c) break;
    pbVar35 = pbVar35 + 1;
  }
LAB_006f4771:
  bVar13 = pbVar35[1];
  pbVar35 = pbVar35 + 1;
LAB_006f4843:
  if (-1 < (char)(anonymous_namespace)::chartype_table[bVar13]) {
    if (bVar13 != 0x21) {
      if (bVar13 == 0x3f) {
        xVar21 = status_bad_pi;
        pbVar33 = pbVar35 + 1;
        if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar35[1]]) goto LAB_006f59bd;
        lVar22 = 4;
        pbVar33 = pbVar35 + 3;
        lVar23 = 1;
        pbVar36 = pbVar35 + 1;
        do {
          pbVar30 = pbVar36;
          lVar28 = lVar23;
          pbVar19 = pbVar33;
          uVar26 = (ulong)*pbVar30;
          pbVar36 = pbVar30 + 1;
          lVar22 = lVar22 + -1;
          pbVar33 = pbVar19 + 1;
          lVar23 = lVar28 + 1;
        } while (((anonymous_namespace)::chartype_table[uVar26] & 0x40) != 0);
        if (*pbVar30 != 0) {
          pbVar33 = pbVar35 + lVar28;
          if (((pbVar35[1] & 0xdf) == 0x58) && ((pbVar35[2] & 0xdf) == 0x4d)) {
            bVar37 = (pbVar35[3] & 0xdf) != 0x4c;
            uVar20 = 1;
            if (lVar22 == 0 && !bVar37) {
              uVar20 = 0x100;
            }
            if ((options & uVar20) == 0) {
LAB_006f4bab:
              do {
                if ((char)uVar26 == '?') {
                  bVar13 = pbVar30[1];
                  if ((bVar13 == 0x3e) || (bVar29 == 0 && bVar13 == 0)) goto LAB_006f4fc6;
                }
                else {
                  pbVar33 = pbVar30;
                  if ((int)uVar26 == 0) goto LAB_006f59bd;
                  bVar13 = pbVar30[1];
                }
                uVar26 = (ulong)bVar13;
                pbVar30 = pbVar30 + 1;
              } while( true );
            }
            if (lVar22 != 0 || bVar37) goto LAB_006f4c7a;
            if (pxVar8->parent != (xml_node_struct *)0x0) goto LAB_006f59bd;
            pxVar8 = append_new_node(pxVar8,alloc,node_declaration);
            if (pxVar8 == (xml_node_struct *)0x0) goto LAB_006f5923;
            bVar37 = true;
          }
          else {
            if ((options & 1) == 0) goto LAB_006f4bab;
LAB_006f4c7a:
            pxVar8 = append_new_node(pxVar8,alloc,node_pi);
            if (pxVar8 == (xml_node_struct *)0x0) {
LAB_006f5923:
              xVar21 = status_out_of_memory;
              goto LAB_006f59bd;
            }
            bVar37 = false;
          }
          pxVar8->name = (char_t *)(pbVar35 + 1);
          bVar13 = *pbVar30;
          *pbVar30 = 0;
          if ((ulong)bVar13 == 0x3f) {
            bVar13 = *pbVar36;
            if ((bVar13 == 0x3e) || (bVar29 == 0 && bVar13 == 0)) {
              pbVar30 = pbVar36 + (bVar13 == 0x3e);
              pxVar8 = pxVar8->parent;
              goto LAB_006f5079;
            }
            pbVar33 = pbVar33 + 1;
          }
          else {
            pbVar33 = pbVar36;
            if (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0) {
              do {
                pbVar35 = pbVar19;
                uVar26 = (ulong)pbVar30[1];
                pbVar30 = pbVar30 + 1;
                pbVar19 = pbVar35 + 1;
              } while (((anonymous_namespace)::chartype_table[uVar26] & 8) != 0);
              do {
                if ((char)uVar26 == '?') {
                  bVar13 = *pbVar35;
                  if ((bVar13 == 0x3e) || (bVar29 == 0 && bVar13 == 0)) goto LAB_006f504d;
                }
                else {
                  if ((int)uVar26 == 0) {
                    pbVar33 = pbVar35 + -1;
                    break;
                  }
                  bVar13 = *pbVar35;
                }
                uVar26 = (ulong)bVar13;
                pbVar35 = pbVar35 + 1;
              } while( true );
            }
          }
          goto LAB_006f59bd;
        }
LAB_006f58c8:
        pbVar33 = pbVar36 + -1;
        goto LAB_006f59bd;
      }
      if (bVar13 != 0x2f) {
        xVar21 = (endch == 0x3f && bVar13 == 0) + status_unrecognized_tag;
        pbVar33 = pbVar35;
        goto LAB_006f59bd;
      }
      pbVar33 = pbVar35 + 1;
      pbVar30 = (byte *)pxVar8->name;
      pbVar35 = pbVar33;
      if (pbVar30 == (byte *)0x0) {
LAB_006f5616:
        xVar21 = status_end_element_mismatch;
        goto LAB_006f59bd;
      }
      while (bVar13 = *pbVar35, ((anonymous_namespace)::chartype_table[bVar13] & 0x40) != 0) {
        bVar14 = *pbVar30;
        pbVar30 = pbVar30 + 1;
        pbVar35 = pbVar35 + 1;
        if (bVar13 != bVar14) goto LAB_006f5616;
      }
      if (*pbVar30 != 0) {
        xVar21 = status_end_element_mismatch;
        if (((bVar13 == 0) && (*pbVar30 == endch)) && (pbVar30[1] == 0)) {
LAB_006f5ad3:
          xVar21 = status_bad_end_element;
          pbVar33 = pbVar35;
        }
        goto LAB_006f59bd;
      }
      pxVar8 = pxVar8->parent;
      pbVar30 = pbVar35;
      do {
        pbVar35 = pbVar30;
        bVar13 = *pbVar35;
        pbVar30 = pbVar35 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0);
      if (bVar13 == 0) goto LAB_006f4f98;
      if (bVar13 != 0x3e) goto LAB_006f5ad3;
      goto LAB_006f46ea;
    }
    bVar13 = pbVar35[1];
    if (bVar13 == 0x5b) {
      if (pbVar35[2] == 0x43) {
        if (pbVar35[3] != 0x44) {
          pbVar35 = pbVar35 + 3;
          goto LAB_006f59b2;
        }
        if (pbVar35[4] != 0x41) {
          pbVar35 = pbVar35 + 4;
          goto LAB_006f59b2;
        }
        if (pbVar35[5] != 0x54) {
          pbVar35 = pbVar35 + 5;
          goto LAB_006f59b2;
        }
        if (pbVar35[6] != 0x41) {
          pbVar35 = pbVar35 + 6;
          goto LAB_006f59b2;
        }
        if (pbVar35[7] != 0x5b) {
          pbVar35 = pbVar35 + 7;
          goto LAB_006f59b2;
        }
        pbVar35 = pbVar35 + 8;
        if ((options & 4) == 0) {
          do {
            if (*pbVar35 == 0x5d) {
              if (pbVar35[1] == 0x5d) {
                if ((pbVar35[2] == 0x3e) || (bVar29 == 0 && pbVar35[2] == 0)) goto LAB_006f5240;
              }
            }
            else if (*pbVar35 == 0) goto LAB_006f59b2;
            pbVar35 = pbVar35 + 1;
          } while( true );
        }
        pxVar9 = append_new_node(pxVar8,alloc,node_cdata);
        if (pxVar9 == (xml_node_struct *)0x0) goto LAB_006f58bb;
        pxVar9->value = (char_t *)pbVar35;
        if ((options & 0x20) == 0) {
          do {
            if (*pbVar35 == 0x5d) {
              if (pbVar35[1] == 0x5d) {
                if ((pbVar35[2] == 0x3e) || (bVar29 == 0 && pbVar35[2] == 0)) goto LAB_006f523b;
              }
            }
            else if (*pbVar35 == 0) goto LAB_006f59b2;
            pbVar35 = pbVar35 + 1;
          } while( true );
        }
        pbVar35 = (byte *)strconv_cdata((char_t *)pbVar35,endch);
        if (pbVar35 != (byte *)0x0) goto LAB_006f5243;
        xVar21 = status_bad_cdata;
        pbVar33 = (byte *)pxVar9->value;
      }
      else {
        pbVar35 = pbVar35 + 2;
LAB_006f59b2:
        xVar21 = status_bad_cdata;
        pbVar33 = pbVar35;
      }
      goto LAB_006f59bd;
    }
    pbVar33 = pbVar35 + 1;
    if (bVar13 != 0x44) {
      if (bVar13 == 0x2d) {
        if (pbVar35[2] == 0x2d) {
          pbVar35 = pbVar35 + 3;
          pxVar9 = pxVar8;
          if ((options & 2) == 0) {
LAB_006f4a67:
            if ((options & 0x22) != 0x22) {
              do {
                if (*pbVar35 == 0x2d) {
                  if (pbVar35[1] == 0x2d) {
                    bVar13 = pbVar35[2];
                    if ((bVar13 == 0x3e) || (bVar29 == 0 && bVar13 == 0)) goto LAB_006f51b1;
                  }
                }
                else if (*pbVar35 == 0) goto LAB_006f598c;
                pbVar35 = pbVar35 + 1;
              } while( true );
            }
            pbVar30 = (byte *)0x0;
            lVar23 = 0;
LAB_006f4a76:
            do {
              bVar13 = *pbVar35;
              pbVar33 = pbVar35;
              if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) == 0) {
                pbVar35 = pbVar35 + 2;
                do {
                  pbVar33 = pbVar35;
                  bVar13 = pbVar33[-1];
                  if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) != 0) {
                    pbVar33 = pbVar33 + -1;
                    goto LAB_006f4ac9;
                  }
                  bVar13 = *pbVar33;
                  if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) != 0)
                  goto LAB_006f4ac9;
                  bVar13 = pbVar33[1];
                  if (((anonymous_namespace)::chartype_table[bVar13] & 0x20) != 0) {
                    pbVar33 = pbVar33 + 1;
                    goto LAB_006f4ac9;
                  }
                  bVar13 = pbVar33[2];
                  pbVar35 = pbVar33 + 4;
                } while (((anonymous_namespace)::chartype_table[bVar13] & 0x20) == 0);
                pbVar33 = pbVar33 + 2;
              }
LAB_006f4ac9:
              if (bVar13 == 0xd) {
                *pbVar33 = 10;
                pbVar35 = pbVar33 + 1;
                if (pbVar33[1] == 10) {
                  if (pbVar30 != (byte *)0x0) {
                    memmove(pbVar30 + -lVar23,pbVar30,(long)(pbVar33 + 1) - (long)pbVar30);
                  }
                  pbVar30 = pbVar33 + 2;
                  lVar23 = lVar23 + 1;
                  pbVar35 = pbVar30;
                }
                goto LAB_006f4a76;
              }
              if (bVar13 == 0x2d) {
                if ((pbVar33[1] == 0x2d) &&
                   ((pbVar33[2] == 0x3e || (bVar29 == 0 && pbVar33[2] == 0)))) goto LAB_006f51d1;
              }
              else if (bVar13 == 0) {
                xVar21 = status_bad_comment;
                pbVar33 = (byte *)pxVar9->value;
                goto LAB_006f59bd;
              }
              pbVar35 = pbVar33 + 1;
            } while( true );
          }
          pxVar9 = append_new_node(pxVar8,alloc,node_comment);
          if (pxVar9 != (xml_node_struct *)0x0) {
            pxVar9->value = (char_t *)pbVar35;
            goto LAB_006f4a67;
          }
          goto LAB_006f58bb;
        }
        pbVar35 = pbVar35 + 2;
LAB_006f598c:
        xVar21 = status_bad_comment;
        pbVar33 = pbVar35;
      }
      else if ((endch != 0x2d) || (xVar21 = status_bad_comment, bVar13 != 0)) {
        xVar21 = (uint)(endch == 0x5b && bVar13 == 0) * 3 + status_unrecognized_tag;
      }
      goto LAB_006f59bd;
    }
    if ((((pbVar35[2] == 0x4f) && (pbVar35[3] == 0x43)) && (pbVar35[4] == 0x54)) &&
       ((pbVar35[5] == 0x59 && (pbVar35[6] == 0x50)))) {
      if ((pbVar35[7] == 0x45) || (endch == 0x45 && pbVar35[7] == 0)) {
        if (pxVar8->parent != (xml_node_struct *)0x0) {
          xVar21 = status_bad_doctype;
          pbVar33 = pbVar35 + -1;
          goto LAB_006f59bd;
        }
        bVar13 = 0x44;
        lVar23 = 0;
LAB_006f4d4e:
        if (0x3b < bVar13) {
          if (bVar13 == 0x3c) {
            if (pbVar33[1] == 0x3f) {
              pbVar33 = pbVar33 + 2;
              do {
                if (*pbVar33 == 0x3f) {
                  if (pbVar33[1] == 0x3e) goto LAB_006f4e63;
                }
                else if (*pbVar33 == 0) goto LAB_006f5916;
                pbVar33 = pbVar33 + 1;
              } while( true );
            }
            if (pbVar33[1] == 0x21) {
              if (pbVar33[2] != 0x2d) {
                if (pbVar33[2] == 0x5b) {
                  pbVar30 = pbVar33 + 3;
                  lVar22 = 0;
LAB_006f4dd8:
                  pbVar30 = pbVar30 + 3;
                  do {
                    bVar13 = pbVar30[-3];
                    if (bVar13 == 0x3c) {
                      if ((pbVar30[-2] == 0x21) && (pbVar30[-1] == 0x5b)) {
                        lVar22 = lVar22 + 1;
                        goto LAB_006f4dd8;
                      }
                    }
                    else if (bVar13 == 0x5d) {
                      if ((pbVar30[-2] == 0x5d) && (pbVar30[-1] == 0x3e)) goto LAB_006f4e1c;
                    }
                    else if (bVar13 == 0) {
                      xVar21 = status_bad_doctype;
                      pbVar33 = pbVar30 + -3;
                      goto LAB_006f59bd;
                    }
                    pbVar30 = pbVar30 + 1;
                  } while( true );
                }
                pbVar30 = pbVar33 + 2;
                lVar23 = lVar23 + 1;
                goto LAB_006f4e36;
              }
              if (pbVar33[3] == 0x2d) {
                pbVar33 = pbVar33 + 4;
                do {
                  if (*pbVar33 == 0x2d) {
                    if ((pbVar33[1] == 0x2d) && (pbVar33[2] == 0x3e)) goto LAB_006f4eaa;
                  }
                  else if (*pbVar33 == 0) break;
                  pbVar33 = pbVar33 + 1;
                } while( true );
              }
            }
LAB_006f5916:
            xVar21 = status_bad_doctype;
            goto LAB_006f59bd;
          }
          if (bVar13 == 0x3e) {
            if (lVar23 == 0) {
              *pbVar33 = 0;
              pbVar33 = pbVar33 + 1;
              goto LAB_006f529a;
            }
            lVar23 = lVar23 + -1;
          }
LAB_006f4e33:
          pbVar30 = pbVar33 + 1;
          goto LAB_006f4e36;
        }
        if ((bVar13 == 0x22) || (bVar13 == 0x27)) {
          pbVar30 = pbVar33 + 1;
          do {
            pbVar33 = pbVar30;
            bVar14 = *pbVar33;
            pbVar30 = pbVar33 + 1;
            if (bVar14 == 0) break;
          } while (bVar14 != bVar13);
          if (bVar14 == 0) goto LAB_006f5916;
          goto LAB_006f4e36;
        }
        if (bVar13 != 0) goto LAB_006f4e33;
        xVar21 = status_bad_doctype;
        if ((endch != 0x3e) || (lVar23 != 0)) goto LAB_006f59bd;
LAB_006f529a:
        pbVar30 = pbVar33;
        if ((options >> 9 & 1) != 0) {
          pbVar35 = pbVar35 + 7;
          do {
            pbVar36 = pbVar35 + 1;
            pbVar35 = pbVar35 + 1;
          } while (((anonymous_namespace)::chartype_table[*pbVar36] & 8) != 0);
          pxVar9 = append_new_node(pxVar8,alloc,node_doctype);
          if (pxVar9 == (xml_node_struct *)0x0) {
            xVar21 = status_out_of_memory;
            goto LAB_006f59bd;
          }
          pxVar9->value = (char_t *)pbVar35;
        }
        goto LAB_006f46ea;
      }
    }
    xVar21 = status_unrecognized_tag;
    goto LAB_006f59bd;
  }
  pxVar8 = append_new_node(pxVar8,alloc,node_element);
  if (pxVar8 == (xml_node_struct *)0x0) goto LAB_006f58bb;
  pxVar8->name = (char_t *)pbVar35;
  pbVar30 = pbVar35 + 1;
  do {
    pbVar33 = pbVar30;
    uVar26 = (ulong)pbVar33[-1];
    bVar13 = (anonymous_namespace)::chartype_table[uVar26];
    if ((bVar13 & 0x40) == 0) {
      pbVar33 = pbVar33 + -1;
      goto LAB_006f4c21;
    }
    uVar26 = (ulong)*pbVar33;
    bVar13 = (anonymous_namespace)::chartype_table[uVar26];
    if ((bVar13 & 0x40) == 0) goto LAB_006f4c21;
    uVar26 = (ulong)pbVar33[1];
    bVar13 = (anonymous_namespace)::chartype_table[uVar26];
    if ((bVar13 & 0x40) == 0) {
      pbVar33 = pbVar33 + 1;
      goto LAB_006f4c21;
    }
    uVar26 = (ulong)pbVar33[2];
    bVar13 = (anonymous_namespace)::chartype_table[uVar26];
    pbVar30 = pbVar33 + 4;
  } while ((bVar13 & 0x40) != 0);
  pbVar33 = pbVar33 + 2;
LAB_006f4c21:
  *pbVar33 = 0;
  pbVar30 = pbVar33 + 1;
  if ((char)uVar26 == '>') goto LAB_006f46ea;
  if ((bVar13 & 8) != 0) goto LAB_006f5088;
  if ((char)uVar26 == '\0') {
    xVar21 = status_bad_start_element;
    pbVar30 = pbVar33;
    if (endch != 0x3e) goto LAB_006f59bd;
    goto LAB_006f46ea;
  }
  if ((int)uVar26 != 0x2f) goto LAB_006f594d;
  bVar13 = *pbVar30;
  if ((bVar13 == 0x3e) || (bVar29 == 0 && bVar13 == 0)) {
    pxVar8 = pxVar8->parent;
    pbVar30 = pbVar30 + (bVar13 == 0x3e);
    goto LAB_006f46ea;
  }
  goto LAB_006f594d;
LAB_006f523b:
  *pbVar35 = 0;
LAB_006f5240:
  pbVar35 = pbVar35 + 1;
LAB_006f5243:
  pbVar30 = pbVar35 + (ulong)(pbVar35[1] == 0x3e) + 1;
  goto LAB_006f46ea;
LAB_006f51b1:
  if ((options & 2) != 0) {
    *pbVar35 = 0;
  }
  pbVar30 = pbVar35 + (ulong)(bVar13 == 0x3e) + 2;
  goto LAB_006f46ea;
LAB_006f51d1:
  pbVar35 = pbVar33;
  if (pbVar30 != (byte *)0x0) {
    memmove(pbVar30 + -lVar23,pbVar30,(long)pbVar33 - (long)pbVar30);
    pbVar35 = pbVar33 + -lVar23;
  }
  *pbVar35 = 0;
  pbVar30 = pbVar33 + (ulong)(pbVar33[2] == 0x3e) + 2;
  goto LAB_006f46ea;
LAB_006f4e63:
  pbVar30 = pbVar33 + 2;
  goto LAB_006f4e36;
LAB_006f4e1c:
  if (lVar22 != 0) {
    lVar22 = lVar22 + -1;
    goto LAB_006f4dd8;
  }
  goto LAB_006f4e36;
LAB_006f4eaa:
  pbVar30 = pbVar33 + 3;
LAB_006f4e36:
  bVar13 = *pbVar30;
  pbVar33 = pbVar30;
  goto LAB_006f4d4e;
LAB_006f4fc6:
  pbVar30 = pbVar30 + (ulong)(bVar13 == 0x3e) + 1;
  goto LAB_006f5079;
LAB_006f504d:
  if (bVar37) {
    pbVar35[-1] = 0x2f;
  }
  else {
    pxVar8->value = (char_t *)pbVar30;
    pxVar8 = pxVar8->parent;
    pbVar35[-1] = 0;
    pbVar30 = pbVar35 + (*pbVar35 == 0x3e);
  }
LAB_006f5079:
  if ((pxVar8->header & 0xf) != 7) goto LAB_006f46ea;
LAB_006f5088:
  while( true ) {
    do {
      pbVar33 = pbVar30;
      bVar13 = *pbVar33;
      pbVar30 = pbVar33 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar13]) break;
    pxVar10 = append_new_attribute(pxVar8,alloc);
    if (pxVar10 == (xml_attribute_struct *)0x0) {
      xVar21 = status_out_of_memory;
      goto LAB_006f59bd;
    }
    pxVar10->name = (char_t *)pbVar33;
    pbVar30 = pbVar33 + 1;
    do {
      pbVar36 = pbVar30;
      bVar13 = pbVar36[-1];
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      if ((bVar14 & 0x40) == 0) {
        pbVar36 = pbVar36 + -1;
        goto LAB_006f510b;
      }
      bVar13 = *pbVar36;
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      if ((bVar14 & 0x40) == 0) goto LAB_006f510b;
      bVar13 = pbVar36[1];
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      if ((bVar14 & 0x40) == 0) {
        pbVar36 = pbVar36 + 1;
        goto LAB_006f510b;
      }
      bVar13 = pbVar36[2];
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
      pbVar30 = pbVar36 + 4;
    } while ((bVar14 & 0x40) != 0);
    pbVar36 = pbVar36 + 2;
LAB_006f510b:
    *pbVar36 = 0;
    while (pbVar36 = pbVar36 + 1, (bVar14 & 8) != 0) {
      bVar13 = *pbVar36;
      bVar14 = (anonymous_namespace)::chartype_table[bVar13];
    }
    xVar21 = status_bad_attribute;
    pbVar33 = pbVar36;
    if (bVar13 != 0x3d) goto LAB_006f59bd;
    do {
      bVar13 = *pbVar36;
      pbVar36 = pbVar36 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar13] & 8) != 0);
    if ((bVar13 != 0x22) && (bVar13 != 0x27)) goto LAB_006f58c8;
    pxVar10->value = (char_t *)pbVar36;
    pbVar33 = (byte *)(*pcVar1)(pbVar36);
    if (pbVar33 == (byte *)0x0) {
      pbVar33 = (byte *)pxVar10->value;
      goto LAB_006f59bd;
    }
    pbVar30 = pbVar33;
    if ((char)(anonymous_namespace)::chartype_table[*pbVar33] < '\0') goto LAB_006f59bd;
  }
  if (bVar13 == 0x3e) goto LAB_006f46ea;
  if (bVar13 != 0x2f) {
    xVar21 = status_bad_start_element;
    if ((endch != 0x3e) || (pbVar30 = pbVar33, bVar13 != 0)) goto LAB_006f59bd;
    goto LAB_006f46ea;
  }
  if (*pbVar30 == 0x3e) {
    pxVar8 = pxVar8->parent;
    pbVar30 = pbVar33 + 2;
    goto LAB_006f46ea;
  }
  if ((endch == 0x3e) && (*pbVar30 == 0)) {
    pxVar8 = pxVar8->parent;
    goto LAB_006f46ea;
  }
LAB_006f594d:
  xVar21 = status_bad_start_element;
  pbVar33 = pbVar30;
  goto LAB_006f59bd;
LAB_006f4f98:
  pbVar30 = pbVar35;
  if (endch != 0x3e) goto LAB_006f5aeb;
  goto LAB_006f46ea;
LAB_006f5aeb:
  xVar21 = status_bad_end_element;
  pbVar33 = pbVar35;
LAB_006f59bd:
  pxVar34 = (xml_parse_result *)(pbVar33 + -(long)pbVar5);
  if (pbVar33 == (byte *)0x0) {
    pxVar34 = (xml_parse_result *)0x0;
  }
  xml_parse_result::xml_parse_result(&local_48);
  local_48.offset = (ptrdiff_t)pxVar34;
  if (xVar21 == status_ok) {
    local_48.status = xVar21;
    if (endch == 0x3c) {
      xml_parse_result::xml_parse_result(__return_storage_ptr__);
      __return_storage_ptr__->status = status_unrecognized_tag;
    }
    else {
      if ((options >> 0xc & 1) != 0) goto LAB_006f5a6f;
      ppxVar12 = &local_78->next_sibling;
      if (local_78 == (xml_node_struct *)0x0) {
        ppxVar12 = &root->first_child;
      }
      for (pxVar8 = *ppxVar12; pxVar8 != (xml_node_struct *)0x0; pxVar8 = pxVar8->next_sibling) {
        if ((pxVar8->header & 0xf) == 2) goto LAB_006f5a6f;
      }
      xml_parse_result::xml_parse_result(__return_storage_ptr__);
      __return_storage_ptr__->status = status_no_document_element;
    }
  }
  else {
    if (((0 < (long)pxVar34) && (pxVar34 == pxVar11)) && (endch == 0)) {
      local_48.offset = (ptrdiff_t)(size - 2);
    }
LAB_006f5a6f:
    __return_storage_ptr__->encoding = local_48.encoding;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_48._20_4_;
    *(ulong *)__return_storage_ptr__ = CONCAT44(local_48._4_4_,xVar21);
    pxVar11 = (xml_parse_result *)local_48.offset;
  }
  __return_storage_ptr__->offset = (ptrdiff_t)pxVar11;
  goto LAB_006f5aaa;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}